

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palrange.h
# Opt level: O2

Arena<void> __thiscall
snmalloc::PalRange<snmalloc::PALLinux>::alloc_range(PalRange<snmalloc::PALLinux> *this,size_t size)

{
  Arena<void> AVar1;
  
  if (size + 0xbfffffffffffffff < 0xc000000000000000) {
    return (Arena<void>)(void *)0x0;
  }
  AVar1.unsafe_capptr = PALLinux::reserve(size);
  return (Arena<void>)AVar1.unsafe_capptr;
}

Assistant:

capptr::Arena<void> alloc_range(size_t size)
    {
      if (bits::next_pow2_bits(size) >= bits::BITS - 1)
      {
        return nullptr;
      }

      if constexpr (pal_supports<AlignedAllocation, PAL>)
      {
        SNMALLOC_ASSERT(size >= PAL::minimum_alloc_size);
        auto result = capptr::Arena<void>::unsafe_from(
          PAL::template reserve_aligned<false>(size));

#ifdef SNMALLOC_TRACING
        message<1024>("Pal range alloc: {} ({})", result.unsafe_ptr(), size);
#endif
        return result;
      }
      else
      {
        auto result = capptr::Arena<void>::unsafe_from(PAL::reserve(size));

#ifdef SNMALLOC_TRACING
        message<1024>("Pal range alloc: {} ({})", result.unsafe_ptr(), size);
#endif

        return result;
      }
    }